

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateOrthogonal::Initialize
          (ChLinkMateOrthogonal *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> mpt1,
          ChVector<double> mpt2,ChVector<double> *mnorm1,ChVector<double> *mnorm2)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined1 auVar7 [16];
  undefined7 in_register_00000009;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  shared_ptr<chrono::ChBodyFrame> local_148;
  shared_ptr<chrono::ChBodyFrame> local_138;
  ChFrame<double> local_128;
  ChFrame<double> local_a0;
  
  if ((int)CONCAT71(in_register_00000009,pos_are_relative) == 0) {
    peVar5 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    dVar1 = *(double *)((long)mpt1.m_data[0] + 8);
    auVar12._8_8_ = *(undefined8 *)mpt1.m_data[0];
    auVar12._0_8_ = *(undefined8 *)mpt1.m_data[0];
    auVar14._8_8_ = *(undefined8 *)((long)mpt1.m_data[0] + 0x10);
    auVar14._0_8_ = *(undefined8 *)((long)mpt1.m_data[0] + 0x10);
    auVar8._0_8_ = dVar1 * *(double *)
                            ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.
                                    Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                            0x18);
    auVar8._8_8_ = dVar1 * *(double *)
                            ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.
                                    Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                            0x20);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(double *)
                    ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         dVar1 * *(double *)
                  ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x28);
    auVar7 = vfmadd231sd_fma(auVar10,auVar12,auVar2);
    auVar2 = vfmadd231pd_fma(auVar8,auVar12,
                             *(undefined1 (*) [16])
                              (peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(double *)
                    ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
    auVar3 = vfmadd231sd_fma(auVar7,auVar14,auVar3);
    auVar2 = vfmadd231pd_fma(auVar2,auVar14,
                             *(undefined1 (*) [16])
                              ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.
                                      Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                              0x30));
    *(undefined1 (*) [16])(this->reldir1).m_data = auVar2;
    (this->reldir1).m_data[2] = auVar3._0_8_;
    peVar5 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    dVar1 = *(double *)((long)mpt1.m_data[1] + 8);
    auVar13._8_8_ = *(undefined8 *)mpt1.m_data[1];
    auVar13._0_8_ = *(undefined8 *)mpt1.m_data[1];
    auVar15._8_8_ = *(undefined8 *)((long)mpt1.m_data[1] + 0x10);
    auVar15._0_8_ = *(undefined8 *)((long)mpt1.m_data[1] + 0x10);
    auVar11._0_8_ =
         dVar1 * *(double *)
                  ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x18);
    auVar11._8_8_ =
         dVar1 * *(double *)
                  ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(double *)
                    ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1 * *(double *)
                            ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.
                                    Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                            0x28);
    auVar3 = vfmadd231sd_fma(auVar9,auVar13,auVar7);
    auVar2 = vfmadd231pd_fma(auVar11,auVar13,
                             *(undefined1 (*) [16])
                              (peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(double *)
                    ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
    auVar3 = vfmadd231sd_fma(auVar3,auVar15,auVar4);
    dVar1 = auVar3._0_8_;
    auVar2 = vfmadd231pd_fma(auVar2,auVar15,
                             *(undefined1 (*) [16])
                              ((long)&(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>.
                                      Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> +
                              0x30));
    *(undefined1 (*) [16])(this->reldir2).m_data = auVar2;
  }
  else {
    if (&this->reldir1 != (ChVector<double> *)mpt1.m_data[0]) {
      (this->reldir1).m_data[0] = *(double *)mpt1.m_data[0];
      (this->reldir1).m_data[1] = *(double *)((long)mpt1.m_data[0] + 8);
      (this->reldir1).m_data[2] = *(double *)((long)mpt1.m_data[0] + 0x10);
    }
    if (&this->reldir2 == (ChVector<double> *)mpt1.m_data[1]) goto LAB_005a7318;
    (this->reldir2).m_data[0] = *(double *)mpt1.m_data[1];
    (this->reldir2).m_data[1] = *(double *)((long)mpt1.m_data[1] + 8);
    dVar1 = *(double *)((long)mpt1.m_data[1] + 0x10);
  }
  (this->reldir2).m_data[2] = dVar1;
LAB_005a7318:
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1 =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2 =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (**(code **)((long)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.
                     super_ChPhysicsItem.super_ChObj._vptr_ChObj + 0x98))
            ((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.
             super_ChPhysicsItem.super_ChObj.ChTime,this,1);
  local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var6 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  p_Var6 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  local_a0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_a0.coord.pos.m_data[0] = (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[0];
  local_a0.coord.pos.m_data[1] = (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[1];
  local_a0.coord.pos.m_data[2] = (this->super_ChLinkMateGeneric).frame1.coord.pos.m_data[2];
  local_a0.coord.rot.m_data[0] = (this->super_ChLinkMateGeneric).frame1.coord.rot.m_data[0];
  local_a0.coord.rot.m_data[1] = (this->super_ChLinkMateGeneric).frame1.coord.rot.m_data[1];
  local_a0.coord.rot.m_data[2] = (this->super_ChLinkMateGeneric).frame1.coord.rot.m_data[2];
  local_a0.coord.rot.m_data[3] = (this->super_ChLinkMateGeneric).frame1.coord.rot.m_data[3];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  local_a0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  local_128._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_128.coord.pos.m_data[0] = (this->super_ChLinkMateGeneric).frame2.coord.pos.m_data[0];
  local_128.coord.pos.m_data[1] = (this->super_ChLinkMateGeneric).frame2.coord.pos.m_data[1];
  local_128.coord.pos.m_data[2] = (this->super_ChLinkMateGeneric).frame2.coord.pos.m_data[2];
  local_128.coord.rot.m_data[0] = (this->super_ChLinkMateGeneric).frame2.coord.rot.m_data[0];
  local_128.coord.rot.m_data[1] = (this->super_ChLinkMateGeneric).frame2.coord.rot.m_data[1];
  local_128.coord.rot.m_data[2] = (this->super_ChLinkMateGeneric).frame2.coord.rot.m_data[2];
  local_128.coord.rot.m_data[3] = (this->super_ChLinkMateGeneric).frame2.coord.rot.m_data[3];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  local_128.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)
        ((long)&(this->super_ChLinkMateGeneric).frame2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  ChLinkMateGeneric::Initialize
            (&this->super_ChLinkMateGeneric,&local_138,&local_148,true,&local_a0,&local_128);
  if (local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLinkMateOrthogonal::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                      std::shared_ptr<ChBodyFrame> mbody2,
                                      bool pos_are_relative,
                                      ChVector<> mpt1,
                                      ChVector<> mpt2,
                                      ChVector<> mnorm1,
                                      ChVector<> mnorm2) {
    // set the two frames so that they have the X axis aligned
    ChVector<> mabsnorm1, mabsnorm2;
    if (pos_are_relative) {
        reldir1 = mnorm1;
        reldir2 = mnorm2;
    } else {
        reldir1 = mbody1->TransformDirectionParentToLocal(mnorm1);
        reldir2 = mbody2->TransformDirectionParentToLocal(mnorm2);
    }

    // do this asap otherwise the following Update() won't work..
    this->Body1 = mbody1.get();
    this->Body2 = mbody2.get();

    // Force the alignment of frames so that the X axis is cross product of two dirs, etc.
    // by calling the custom update function of ChLinkMateOrthogonal.
    this->Update(this->ChTime);

    // Perform initialization (set pointers to variables, etc.)
    ChLinkMateGeneric::Initialize(mbody1, mbody2,
                                  true,  // recycle already-updated frames
                                  this->frame1, this->frame2);
}